

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O3

bool slang::ast::Expression::collectArgs
               (ASTContext *context,ArgumentListSyntax *syntax,
               SmallVectorBase<const_slang::syntax::SyntaxNode_*> *orderedArgs,
               NamedArgMap *namedArgs)

{
  char *pcVar1;
  SyntaxKind SVar2;
  NamedArgumentSyntax *this;
  long lVar3;
  int iVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar8;
  uint64_t hash;
  SourceLocation SVar9;
  Diagnostic *this_00;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong pos0;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  char cVar16;
  char cVar17;
  char cVar18;
  byte bVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  byte bVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  byte bVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  byte bVar31;
  try_emplace_args_t local_f1;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_f0;
  string_view name;
  locator res;
  pair<const_slang::syntax::NamedArgumentSyntax_*,_bool> local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  uVar13 = (syntax->parameters).elements._M_extent._M_extent_value + 1;
  if (1 < uVar13) {
    local_f0 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
               &(namedArgs->super_Storage).field_0x108;
    uVar14 = 0;
    do {
      ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((syntax->parameters).elements._M_ptr + uVar14 * 2));
      this = (NamedArgumentSyntax *)*ppSVar8;
      SVar2 = (this->super_ArgumentSyntax).super_SyntaxNode.kind;
      if (SVar2 == NamedArgument) {
        name = parsing::Token::valueText(&this->name);
        if (name._M_len != 0) {
          local_68.second = false;
          local_68.first = this;
          hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           (local_f0,&name);
          pos0 = hash >> (namedArgs->field_0x110 & 0x3f);
          lVar10 = (hash & 0xff) * 4;
          cVar16 = (&UNK_0047072c)[lVar10];
          cVar17 = (&UNK_0047072d)[lVar10];
          cVar18 = (&UNK_0047072e)[lVar10];
          bVar19 = (&UNK_0047072f)[lVar10];
          uVar12 = 0;
          uVar11 = pos0;
          cVar20 = cVar16;
          cVar21 = cVar17;
          cVar22 = cVar18;
          bVar23 = bVar19;
          cVar24 = cVar16;
          cVar25 = cVar17;
          cVar26 = cVar18;
          bVar27 = bVar19;
          cVar28 = cVar16;
          cVar29 = cVar17;
          cVar30 = cVar18;
          bVar31 = bVar19;
          do {
            lVar10 = *(long *)&namedArgs->field_0x120;
            pcVar1 = (char *)(lVar10 + uVar11 * 0x10);
            local_48 = *pcVar1;
            cStack_47 = pcVar1[1];
            cStack_46 = pcVar1[2];
            bStack_45 = pcVar1[3];
            cStack_44 = pcVar1[4];
            cStack_43 = pcVar1[5];
            cStack_42 = pcVar1[6];
            bStack_41 = pcVar1[7];
            cStack_40 = pcVar1[8];
            cStack_3f = pcVar1[9];
            cStack_3e = pcVar1[10];
            bStack_3d = pcVar1[0xb];
            cStack_3c = pcVar1[0xc];
            cStack_3b = pcVar1[0xd];
            cStack_3a = pcVar1[0xe];
            bVar6 = pcVar1[0xf];
            auVar15[0] = -(local_48 == cVar16);
            auVar15[1] = -(cStack_47 == cVar17);
            auVar15[2] = -(cStack_46 == cVar18);
            auVar15[3] = -(bStack_45 == bVar19);
            auVar15[4] = -(cStack_44 == cVar20);
            auVar15[5] = -(cStack_43 == cVar21);
            auVar15[6] = -(cStack_42 == cVar22);
            auVar15[7] = -(bStack_41 == bVar23);
            auVar15[8] = -(cStack_40 == cVar24);
            auVar15[9] = -(cStack_3f == cVar25);
            auVar15[10] = -(cStack_3e == cVar26);
            auVar15[0xb] = -(bStack_3d == bVar27);
            auVar15[0xc] = -(cStack_3c == cVar28);
            auVar15[0xd] = -(cStack_3b == cVar29);
            auVar15[0xe] = -(cStack_3a == cVar30);
            auVar15[0xf] = -(bVar6 == bVar31);
            uVar7 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
            bStack_39 = bVar6;
            if (uVar7 != 0) {
              lVar3 = *(long *)&namedArgs->field_0x128;
              local_58 = cVar16;
              cStack_57 = cVar17;
              cStack_56 = cVar18;
              bStack_55 = bVar19;
              cStack_54 = cVar20;
              cStack_53 = cVar21;
              cStack_52 = cVar22;
              bStack_51 = bVar23;
              cStack_50 = cVar24;
              cStack_4f = cVar25;
              cStack_4e = cVar26;
              bStack_4d = bVar27;
              cStack_4c = cVar28;
              cStack_4b = cVar29;
              cStack_4a = cVar30;
              bStack_49 = bVar31;
              do {
                iVar4 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
                  }
                }
                __y = (basic_string_view<char,_std::char_traits<char>_> *)
                      ((ulong)(uint)(iVar4 << 5) + lVar3 + uVar11 * 0x1e0);
                bVar5 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)local_f0,&name,__y);
                if (bVar5) {
                  SVar9 = parsing::Token::location(&this->name);
                  this_00 = ASTContext::addDiag(context,(DiagCode)0x4a0007,SVar9);
                  Diagnostic::operator<<(this_00,name);
                  SVar9 = parsing::Token::location((Token *)(__y[1]._M_len + 0x28));
                  Diagnostic::addNote(this_00,(DiagCode)0xc0001,SVar9);
                  goto LAB_00415cd8;
                }
                uVar7 = uVar7 - 1 & uVar7;
              } while (uVar7 != 0);
              bVar6 = *(byte *)(lVar10 + uVar11 * 0x10 + 0xf);
              cVar16 = local_58;
              cVar17 = cStack_57;
              cVar18 = cStack_56;
              bVar19 = bStack_55;
              cVar20 = cStack_54;
              cVar21 = cStack_53;
              cVar22 = cStack_52;
              bVar23 = bStack_51;
              cVar24 = cStack_50;
              cVar25 = cStack_4f;
              cVar26 = cStack_4e;
              bVar27 = bStack_4d;
              cVar28 = cStack_4c;
              cVar29 = cStack_4b;
              cVar30 = cStack_4a;
              bVar31 = bStack_49;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar6) == 0) break;
            lVar10 = uVar11 + uVar12;
            uVar12 = uVar12 + 1;
            uVar11 = lVar10 + 1U & *(ulong *)&namedArgs->field_0x118;
          } while (uVar12 <= *(ulong *)&namedArgs->field_0x118);
          if (*(ulong *)&namedArgs->field_0x138 < *(ulong *)&namedArgs->field_0x130) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
                             *)local_f0,(arrays_type *)&namedArgs->field_0x110,pos0,hash,&local_f1,
                       &name,&local_68);
            *(long *)&namedArgs->field_0x138 = *(long *)&namedArgs->field_0x138 + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
                             *)local_f0,hash,&local_f1,&name,&local_68);
          }
        }
      }
      else {
        if (*(long *)&namedArgs->field_0x138 != 0) {
          res._0_16_ = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)this);
          SVar9 = parsing::Token::location((Token *)&res);
          ASTContext::addDiag(context,(DiagCode)0x720007,SVar9);
          return false;
        }
        if (SVar2 != EmptyArgument) {
          this = *(NamedArgumentSyntax **)&this->dot;
        }
        res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)this;
        SmallVectorBase<slang::syntax::SyntaxNode_const*>::
        emplace_back<slang::syntax::SyntaxNode_const*>
                  ((SmallVectorBase<slang::syntax::SyntaxNode_const*> *)orderedArgs,
                   (SyntaxNode **)&res);
      }
LAB_00415cd8:
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar13 >> 1);
  }
  return true;
}

Assistant:

bool Expression::collectArgs(const ASTContext& context, const ArgumentListSyntax& syntax,
                             SmallVectorBase<const SyntaxNode*>& orderedArgs,
                             NamedArgMap& namedArgs) {
    // Collect all arguments into a list of ordered expressions (which can
    // optionally be nullptr to indicate an empty argument) and a map of
    // named argument assignments.
    for (auto arg : syntax.parameters) {
        if (arg->kind == SyntaxKind::NamedArgument) {
            const NamedArgumentSyntax& nas = arg->as<NamedArgumentSyntax>();
            auto name = nas.name.valueText();
            if (!name.empty()) {
                auto pair = namedArgs.emplace(name, std::make_pair(&nas, false));
                if (!pair.second) {
                    auto& diag = context.addDiag(diag::DuplicateArgAssignment, nas.name.location());
                    diag << name;
                    diag.addNote(diag::NotePreviousUsage,
                                 pair.first->second.first->name.location());
                }
            }
        }
        else {
            // Once a named argument has been seen, no more ordered arguments are allowed.
            if (!namedArgs.empty()) {
                context.addDiag(diag::MixingOrderedAndNamedArgs, arg->getFirstToken().location());
                return false;
            }

            if (arg->kind == SyntaxKind::EmptyArgument)
                orderedArgs.push_back(arg);
            else
                orderedArgs.push_back(arg->as<OrderedArgumentSyntax>().expr);
        }
    }
    return true;
}